

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.h
# Opt level: O2

void __thiscall
ResourceDeleter<const_AmsNetId>::operator()
          (ResourceDeleter<const_AmsNetId> *this,AmsNetId *resource)

{
  std::function<long_(AmsNetId)>::operator()(&this->FreeResource,*(AmsNetId *)resource->b);
  operator_delete(resource);
  return;
}

Assistant:

void operator()(T* resource) noexcept
    {
        FreeResource(*resource);
        delete resource;
    }